

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl
          (ChElementCableANCF *this,ChVector<double> *pA,ChVector<double> *dA,ChVector<double> *pB,
          ChVector<double> *dB,ChVector<double> *pA_dt,ChVector<double> *dA_dt,
          ChVector<double> *pB_dt,ChVector<double> *dB_dt,ChVectorDynamic<> *Fi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  element_type *peVar9;
  undefined1 (*pauVar10) [64];
  undefined1 auVar11 [32];
  Index index;
  void *pvVar12;
  long lVar13;
  undefined8 *puVar14;
  double *pdVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ChVectorN<double,_12> Fcurv;
  ChVectorN<double,_12> Faxial;
  ChVectorN<double,_12> vel_vector;
  ChMatrixNM<double,_4,_3> d;
  CableANCF_ForceAxial myformulaAx;
  CableANCF_ForceCurv myformulaCurv;
  undefined1 local_900 [32];
  undefined1 auStack_8e0 [32];
  undefined1 aauStack_8c0 [2] [32];
  Matrix<double,_12,_1,_0,_12,_1> local_880;
  undefined1 local_800 [64];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [64];
  undefined1 local_760 [32];
  ChIntegrable1D<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> local_740;
  ChElementCableANCF *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  ChIntegrable1D<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> local_560;
  ChElementCableANCF *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  undefined1 auVar18 [64];
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                  ,0x1bc,
                  "void chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl(const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, ChVectorDynamic<> &)"
                 );
  }
  peVar9 = (this->section).
           super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar9 == (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                  ,0x1bd,
                  "void chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl(const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, ChVectorDynamic<> &)"
                 );
  }
  dVar1 = *(double *)(peVar9 + 0x20);
  dVar2 = *(double *)(peVar9 + 0x28);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2;
  auVar16._8_8_ = 0x8000000000000000;
  auVar16._0_8_ = 0x8000000000000000;
  auVar16 = vxorpd_avx512vl(auVar21,auVar16);
  dVar3 = *(double *)(peVar9 + 0x18);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = pA->m_data[2];
  vbroadcastsd_avx512f(auVar5);
  auVar17 = vpermt2pd_avx512f(_DAT_00982b80,ZEXT1664(*(undefined1 (*) [16])dA->m_data));
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dA->m_data[2];
  auVar18 = vbroadcastsd_avx512f(auVar6);
  auVar19._0_40_ = auVar17._0_40_;
  auVar19._40_8_ = auVar18._40_8_;
  auVar19._48_8_ = auVar17._48_8_;
  auVar19._56_8_ = auVar17._56_8_;
  local_7a0 = vinsertf32x4_avx512f(auVar19,*(undefined1 (*) [16])pB->m_data,3);
  auVar11 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])dB->m_data),0xd0);
  auVar11 = vblendps_avx(auVar11,ZEXT832((ulong)pB->m_data[2]),3);
  dVar4 = dB->m_data[2];
  auVar23._8_8_ = dVar4;
  auVar23._0_8_ = dVar4;
  auVar23._16_8_ = dVar4;
  auVar23._24_8_ = dVar4;
  local_760 = vblendps_avx(auVar11,auVar23,0xc0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = pA_dt->m_data[2];
  vbroadcastsd_avx512f(auVar7);
  auVar17 = vpermt2pd_avx512f(_DAT_00982b80,ZEXT1664(*(undefined1 (*) [16])dA_dt->m_data));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dA_dt->m_data[2];
  auVar18 = vbroadcastsd_avx512f(auVar8);
  auVar20._0_40_ = auVar17._0_40_;
  auVar20._40_8_ = auVar18._40_8_;
  auVar20._48_8_ = auVar17._48_8_;
  auVar20._56_8_ = auVar17._56_8_;
  local_800 = vinsertf32x4_avx512f(auVar20,*(undefined1 (*) [16])pB_dt->m_data,3);
  auVar11 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])dB_dt->m_data),0xd0);
  auVar11 = vblendps_avx(auVar11,ZEXT832((ulong)pB_dt->m_data[2]),3);
  dVar4 = dB_dt->m_data[2];
  auVar24._8_8_ = dVar4;
  auVar24._0_8_ = dVar4;
  auVar24._16_8_ = dVar4;
  auVar24._24_8_ = dVar4;
  local_740._vptr_ChIntegrable1D = (_func_int **)&PTR__ChIntegrable1D_00b33918;
  local_7c0 = vblendps_avx(auVar11,auVar24,0xc0);
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[8]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[9]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [10] = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[1]
       = SUB128(ZEXT812(0),4);
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[4]
       = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[8];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[5]
       = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[9];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[6]
       = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[10];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[7]
       = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[0xb];
  local_738 = this;
  local_730 = local_7a0;
  local_728 = local_800;
  ChQuadrature::Integrate1D<Eigen::Matrix<double,12,1,0,12,1>>(&local_880,&local_740,0.0,1.0,5);
  dVar3 = auVar16._0_8_ * dVar3 * (this->super_ChElementBeam).length;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[0]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[0];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[1]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[1];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[2]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[2];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[3]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[3];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[4]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[4];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[5]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[5];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[6]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[6];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[7]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[7];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[8]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[8];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[9]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[9];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [10] = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[10];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0xb] = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
                  .m_data.array[0xb];
  pdVar15 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    if (pdVar15 != (double *)0x0) {
      free((void *)pdVar15[-1]);
    }
    pvVar12 = malloc(0xa0);
    if (pvVar12 == (void *)0x0) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(((ulong)pvVar12 & 0xffffffffffffffc0) + 0x38) = pvVar12;
    pdVar15 = (double *)(((ulong)pvVar12 & 0xffffffffffffffc0) + 0x40);
    (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar15;
    (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0xc;
  }
  lVar13 = 8;
  *pdVar15 = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
             m_data.array[0];
  pdVar15[1] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[1];
  pdVar15[2] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[2];
  pdVar15[3] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[3];
  pdVar15[4] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[4];
  pdVar15[5] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[5];
  pdVar15[6] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[6];
  pdVar15[7] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[7];
  do {
    pdVar15[lVar13] =
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0xc);
  local_900 = SUB6432(ZEXT864(0),0) << 0x20;
  aauStack_8c0[0] = (undefined1  [32])0x0;
  local_560._vptr_ChIntegrable1D = (_func_int **)&PTR__ChIntegrable1D_00b33958;
  auStack_8e0 = aauStack_8c0[0];
  local_558 = this;
  local_550 = local_7a0;
  local_548 = local_800;
  ChQuadrature::Integrate1D<Eigen::Matrix<double,12,1,0,12,1>>
            ((Matrix<double,_12,_1,_0,_12,_1> *)local_900,&local_560,0.0,1.0,3);
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0xc)
  {
    pauVar10 = (undefined1 (*) [64])
               (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    lVar13 = 0;
    dVar1 = dVar2 * dVar1 * (this->super_ChElementBeam).length;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar1;
    auVar18 = vbroadcastsd_avx512f(auVar22);
    auVar17._32_32_ = auStack_8e0;
    auVar17._0_32_ = local_900;
    auVar17 = vmulpd_avx512f(auVar18,auVar17);
    auVar17 = vaddpd_avx512f(auVar17,*(undefined1 (*) [64])
                                      (this->m_GenForceVec0).
                                      super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                                      .m_storage.m_data.array);
    auVar17 = vsubpd_avx512f(*pauVar10,auVar17);
    *pauVar10 = auVar17;
    do {
      *(double *)(pauVar10[1] + lVar13 * 8) =
           *(double *)(pauVar10[1] + lVar13 * 8) -
           (dVar1 * *(double *)(aauStack_8c0[0] + lVar13 * 8) +
           (this->m_GenForceVec0).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
           m_storage.m_data.array[lVar13 + 8]);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    return;
  }
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 12, 1>>, const Eigen::Matrix<double, 12, 1>>, const Eigen::Matrix<double, 12, 1>>, Functor = Eigen::internal::sub_assign_op<double, double>]"
               );
}

Assistant:

void ChElementCableANCF::ComputeInternalForces_Impl(const ChVector<>& pA,
                                                    const ChVector<>& dA,
                                                    const ChVector<>& pB,
                                                    const ChVector<>& dB,
                                                    const ChVector<>& pA_dt,
                                                    const ChVector<>& dA_dt,
                                                    const ChVector<>& pB_dt,
                                                    const ChVector<>& dB_dt,
                                                    ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);
    assert(section);

    double Area = section->Area;
    double E = section->E;
    double I = section->I;

    // this matrix will be used in both CableANCF_ForceAxial and CableANCF_ForceCurv integrators
    ChMatrixNM<double, 4, 3> d;
    d(0, 0) = pA.x();
    d(0, 1) = pA.y();
    d(0, 2) = pA.z();
    d(1, 0) = dA.x();
    d(1, 1) = dA.y();
    d(1, 2) = dA.z();
    d(2, 0) = pB.x();
    d(2, 1) = pB.y();
    d(2, 2) = pB.z();
    d(3, 0) = dB.x();
    d(3, 1) = dB.y();
    d(3, 2) = dB.z();

    // this matrix will be used in both CableANCF_ForceAxial and CableANCF_ForceCurv integrators
    ChVectorN<double, 12> vel_vector;
    vel_vector(0) = pA_dt.x();
    vel_vector(1) = pA_dt.y();
    vel_vector(2) = pA_dt.z();
    vel_vector(3) = dA_dt.x();
    vel_vector(4) = dA_dt.y();
    vel_vector(5) = dA_dt.z();
    vel_vector(6) = pB_dt.x();
    vel_vector(7) = pB_dt.y();
    vel_vector(8) = pB_dt.z();
    vel_vector(9) = dB_dt.x();
    vel_vector(10) = dB_dt.y();
    vel_vector(11) = dB_dt.z();

    // 1)
    // Integrate   (strainD'*strain)

    class CableANCF_ForceAxial : public ChIntegrable1D<ChVectorN<double, 12>> {
      public:
        ChElementCableANCF* element;
        ChMatrixNM<double, 4, 3>* d;  // this is an external matrix, use pointer
        ChVectorN<double, 12>* d_dt;  // this is an external matrix, use pointer
        ChMatrixNM<double, 3, 12> Sd;
        ChElementCableANCF::ShapeVector Nd;
        ChMatrixNM<double, 1, 12> strainD;
        ChMatrixNM<double, 1, 3> Nd_d;

        // Evaluate (strainD'*strain)  at point x
        virtual void Evaluate(ChVectorN<double, 12>& result, const double x) override {
            element->ShapeFunctionsDerivatives(Nd, x);

            // Sd=[Nd1*eye(3) Nd2*eye(3) Nd3*eye(3) Nd4*eye(3)]
            Sd.setZero();
            for (int i = 0; i < 4; i++) {
                Sd(0, 3 * i + 0) = Nd(i);
                Sd(1, 3 * i + 1) = Nd(i);
                Sd(2, 3 * i + 2) = Nd(i);
            }

            Nd_d = Nd * (*d);
            strainD = Nd_d * Sd;

            // strain = (Nd*(d*d')*Nd'-1)*0.5;
            double strain = 0.5 * (Nd_d.dot(Nd_d) - 1);

            // Add damping forces if selected
            if (element->m_use_damping)
                strain += (element->m_alpha) * (strainD * (*d_dt))(0, 0);

            result = strainD.transpose() * strain;
        }
    };

    CableANCF_ForceAxial myformulaAx;
    myformulaAx.d = &d;
    myformulaAx.d_dt = &vel_vector;
    myformulaAx.element = this;

    ChVectorN<double, 12> Faxial;
    Faxial.setZero();
    ChQuadrature::Integrate1D<ChVectorN<double, 12>>(Faxial,       // result of integration will go there
                                                     myformulaAx,  // formula to integrate
                                                     0,            // start of x
                                                     1,            // end of x
                                                     5             // order of integration
    );
    Faxial *= -E * Area * length;

    Fi = Faxial;

    // 2)
    // Integrate   (k_e'*k_e)

    class CableANCF_ForceCurv : public ChIntegrable1D<ChVectorN<double, 12>> {
      public:
        ChElementCableANCF* element;
        ChMatrixNM<double, 4, 3>* d;  // this is an external matrix, use pointer
        ChVectorN<double, 12>* d_dt;  // this is an external matrix, use pointer
        ChMatrixNM<double, 3, 12> Sd;
        ChMatrixNM<double, 3, 12> Sdd;
        ChElementCableANCF::ShapeVector Nd;
        ChElementCableANCF::ShapeVector Ndd;
        ChMatrixNM<double, 1, 12> g_e;
        ChMatrixNM<double, 1, 12> f_e;
        ChMatrixNM<double, 1, 12> k_e;
        ChMatrixNM<double, 3, 12> fe1;

        // Evaluate  at point x
        virtual void Evaluate(ChVectorN<double, 12>& result, const double x) override {
            element->ShapeFunctionsDerivatives(Nd, x);
            element->ShapeFunctionsDerivatives2(Ndd, x);

            // Sd=[Nd1*eye(3) Nd2*eye(3) Nd3*eye(3) Nd4*eye(3)]
            // Sdd=[Ndd1*eye(3) Ndd2*eye(3) Ndd3*eye(3) Ndd4*eye(3)]
            Sd.setZero();
            for (int i = 0; i < 4; i++) {
                Sd(0, 3 * i + 0) = Nd(i);
                Sd(1, 3 * i + 1) = Nd(i);
                Sd(2, 3 * i + 2) = Nd(i);
            }

            Sdd.setZero();
            for (int i = 0; i < 4; i++) {
                Sdd(0, 3 * i + 0) = Ndd(i);
                Sdd(1, 3 * i + 1) = Ndd(i);
                Sdd(2, 3 * i + 2) = Ndd(i);
            }

            ChVector<> vr_x((*d).transpose() * Nd.transpose());
            ChVector<> vr_xx((*d).transpose() * Ndd.transpose());
            ChVector<> vf1 = Vcross(vr_x, vr_xx);
            double f = vf1.Length();
            double g1 = vr_x.Length();
            double g = pow(g1, 3);
            double k = f / g;

            g_e = (3 * g1) * Nd * (*d) * Sd;

            // do:  fe1=cross(Sd,r_xxrep)+cross(r_xrep,Sdd);
            for (int col = 0; col < 12; ++col) {
                ChVector<> Sd_i = Sd.col(col);
                fe1.col(col) = Vcross(Sd_i, vr_xx).eigen();
                ChVector<> Sdd_i = Sdd.col(col);
                fe1.col(col) += Vcross(vr_x, Sdd_i).eigen();
            }
            ChVectorN<double, 3> f1 = vf1.eigen();

            if (f == 0)
                f_e = f1.transpose() * fe1;
            else {
                f_e = (1 / f) * f1.transpose() * fe1;
            }

            k_e = (f_e * g - g_e * f) * (1 / (pow(g, 2)));

            // Add damping if selected by user: curvature rate
            if (element->m_use_damping)
                k += (element->m_alpha) * (k_e * (*d_dt))(0, 0);

            result = k * k_e.transpose();
        }
    };

    CableANCF_ForceCurv myformulaCurv;
    myformulaCurv.d = &d;
    myformulaCurv.d_dt = &vel_vector;
    myformulaCurv.element = this;

    ChVectorN<double, 12> Fcurv;
    Fcurv.setZero();
    ChQuadrature::Integrate1D<ChVectorN<double, 12>>(Fcurv,          // result of integration will go there
                                                     myformulaCurv,  // formula to integrate
                                                     0,              // start of x
                                                     1,              // end of x
                                                     3               // order of integration
    );

    // Also subtract contribution of initial configuration
    Fi -= (E * I * length) * Fcurv + m_GenForceVec0;
}